

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

StringView __thiscall
anon_unknown.dwarf_2dcf93::SpecialSubstitution::getBaseName(SpecialSubstitution *this)

{
  long lVar1;
  StringView SVar2;
  
  lVar1 = (long)*(int *)&(this->super_Node).field_0xc;
  SVar2.Last = &DAT_001a7f58 + *(int *)(&DAT_001a7f58 + lVar1 * 4);
  SVar2.First = &DAT_001a7f70 + *(int *)(&DAT_001a7f70 + lVar1 * 4);
  return SVar2;
}

Assistant:

StringView getBaseName() const override {
    switch (SSK) {
    case SpecialSubKind::allocator:
      return StringView("allocator");
    case SpecialSubKind::basic_string:
      return StringView("basic_string");
    case SpecialSubKind::string:
      return StringView("string");
    case SpecialSubKind::istream:
      return StringView("istream");
    case SpecialSubKind::ostream:
      return StringView("ostream");
    case SpecialSubKind::iostream:
      return StringView("iostream");
    }
    LLVM_BUILTIN_UNREACHABLE;
  }